

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

QStringList * __thiscall
QProcess::splitCommand(QStringList *__return_storage_ptr__,QProcess *this,QStringView command)

{
  QChar ch;
  Data *data;
  bool bVar1;
  int iVar2;
  QProcess *pQVar3;
  bool bVar4;
  char32_t ucs4;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  iVar2 = 0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  if (0 < (long)this) {
    pQVar3 = (QProcess *)0x0;
    bVar4 = false;
    do {
      ch.ucs = *(char16_t *)(command.m_size + (long)pQVar3 * 2);
      if (ch.ucs == L'\"') {
        iVar2 = iVar2 + 1;
        if (iVar2 == 3) {
          QString::append(&local_58,(QChar)0x22);
LAB_0042b9ee:
          iVar2 = 0;
        }
      }
      else {
        bVar4 = (bool)(bVar4 ^ iVar2 == 1);
        if ((bVar4) ||
           (((4 < (ushort)ch.ucs - 9 && (ch.ucs != L' ')) &&
            ((ucs4 = (char32_t)(ushort)ch.ucs, (uint)ucs4 < 0x80 ||
             (((ucs4 != L'\x85' && (ucs4 != L'\xa0')) &&
              (bVar1 = QChar::isSpace_helper(ucs4), !bVar1)))))))) {
          QString::append(&local_58,ch);
          goto LAB_0042b9ee;
        }
        iVar2 = 0;
        if (local_58.d.size != 0) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_58);
          QList<QString>::end(__return_storage_ptr__);
          data = local_58.d.d;
          if (local_58.d.ptr != (char16_t *)0x0) {
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (char16_t *)0x0;
            local_58.d.size = 0;
            if (&data->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&data->super_QArrayData,2,0x10);
              }
            }
          }
        }
      }
      pQVar3 = (QProcess *)((long)&(pQVar3->super_QIODevice).super_QObject._vptr_QObject + 1);
    } while (this != pQVar3);
  }
  if (local_58.d.size != 0) {
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_58);
    QList<QString>::end(__return_storage_ptr__);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QProcess::splitCommand(QStringView command)
{
    QStringList args;
    QString tmp;
    int quoteCount = 0;
    bool inQuote = false;

    // handle quoting. tokens can be surrounded by double quotes
    // "hello world". three consecutive double quotes represent
    // the quote character itself.
    for (int i = 0; i < command.size(); ++i) {
        if (command.at(i) == u'"') {
            ++quoteCount;
            if (quoteCount == 3) {
                // third consecutive quote
                quoteCount = 0;
                tmp += command.at(i);
            }
            continue;
        }
        if (quoteCount) {
            if (quoteCount == 1)
                inQuote = !inQuote;
            quoteCount = 0;
        }
        if (!inQuote && command.at(i).isSpace()) {
            if (!tmp.isEmpty()) {
                args += tmp;
                tmp.clear();
            }
        } else {
            tmp += command.at(i);
        }
    }
    if (!tmp.isEmpty())
        args += tmp;

    return args;
}